

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O1

bool asio_service_test::test_read_empty_meta
               (atomic<unsigned_long> *count,meta_cb_params *params,string *meta)

{
  pointer pcVar1;
  long lVar2;
  ostream oVar3;
  int iVar4;
  ostream *poVar5;
  ostream *poVar6;
  bool bVar7;
  string _v;
  string _ev;
  char *local_98;
  size_t local_90;
  char local_88 [16];
  char *local_78;
  size_t local_70;
  char local_68 [16];
  char *local_58;
  long local_50;
  char local_48 [16];
  pthread_t local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&test_read_empty_meta::lock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_70 = 0;
  local_68[0] = '\0';
  pcVar1 = (meta->_M_dataplus)._M_p;
  local_98 = local_88;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + meta->_M_string_length);
  bVar7 = true;
  if (local_70 == local_90) {
    if (local_70 == 0) {
      bVar7 = false;
    }
    else {
      iVar4 = bcmp(local_78,local_98,local_70);
      bVar7 = iVar4 != 0;
    }
  }
  if (bVar7) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[33m",5);
    lVar2 = *(long *)poVar5;
    *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar6 = poVar5 + *(long *)(lVar2 + -0x18);
    if (poVar5[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar3 = (ostream)std::ios::widen((char)poVar6);
      poVar6[0xe0] = oVar3;
      poVar6[0xe1] = (ostream)0x1;
    }
    poVar6[0xe0] = (ostream)0x30;
    local_38 = pthread_self();
    std::_Hash_bytes(&local_38,8,0xc70f6907);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"test_read_empty_meta",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[1;35m",7);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    value of: \x1b[1;34mmeta\x1b[0m\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    expected: \x1b[1;32m",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_78,local_70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"      actual: \x1b[1;31m",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_98,local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m\n",5);
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    TestSuite::failHandler();
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    if ((bool)(count == (atomic<unsigned_long> *)0x0 | bVar7)) goto LAB_0018bb88;
  }
  else {
    if (local_98 != local_88) {
      operator_delete(local_98);
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    if (count == (atomic<unsigned_long> *)0x0) goto LAB_0018bb88;
  }
  LOCK();
  (count->super___atomic_base<unsigned_long>)._M_i =
       (count->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
LAB_0018bb88:
  pthread_mutex_unlock((pthread_mutex_t *)&test_read_empty_meta::lock);
  return true;
}

Assistant:

bool test_read_empty_meta( std::atomic<size_t>* count,
                           const asio_service::meta_cb_params& params,
                           const std::string& meta )
{
    static std::mutex lock;
    std::lock_guard<std::mutex> l(lock);

    CHK_EQ( std::string(), meta );

    if (count) (*count)++;
    return true;
}